

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data_common.c
# Opt level: O0

lyd_node *
lys_getnext_data(lyd_node *last,lyd_node *sibling,lysc_node **slast,lysc_node *parent,
                lysc_module *module)

{
  LY_ERR LVar1;
  lyd_node *local_48;
  lyd_node *match;
  lysc_node *siter;
  lysc_module *module_local;
  lysc_node *parent_local;
  lysc_node **slast_local;
  lyd_node *sibling_local;
  lyd_node *last_local;
  
  match = (lyd_node *)0x0;
  local_48 = (lyd_node *)0x0;
  siter = (lysc_node *)module;
  module_local = (lysc_module *)parent;
  parent_local = (lysc_node *)slast;
  slast_local = (lysc_node **)sibling;
  sibling_local = last;
  if ((parent == (lysc_node *)0x0) && (module == (lysc_module *)0x0)) {
    __assert_fail("parent || module",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/tree_data_common.c"
                  ,0xa8,
                  "struct lyd_node *lys_getnext_data(const struct lyd_node *, const struct lyd_node *, const struct lysc_node **, const struct lysc_node *, const struct lysc_module *)"
                 );
  }
  if ((last != (lyd_node *)0x0) && ((slast == (lysc_node **)0x0 || (*slast == (lysc_node *)0x0)))) {
    __assert_fail("!last || (slast && *slast)",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/tree_data_common.c"
                  ,0xa9,
                  "struct lyd_node *lys_getnext_data(const struct lyd_node *, const struct lyd_node *, const struct lysc_node **, const struct lysc_node *, const struct lysc_module *)"
                 );
  }
  if (slast != (lysc_node **)0x0) {
    match = (lyd_node *)*slast;
  }
  if (((last == (lyd_node *)0x0) || (last->next == (lyd_node *)0x0)) ||
     (last->next->schema != (lysc_node *)match)) {
    do {
      match = (lyd_node *)
              lys_getnext((lysc_node *)match,(lysc_node *)module_local,(lysc_module *)siter,0);
      if ((lysc_node *)match == (lysc_node *)0x0) break;
      LVar1 = lyd_find_sibling_val
                        ((lyd_node *)slast_local,(lysc_node *)match,(char *)0x0,0,&local_48);
    } while (LVar1 != LY_SUCCESS);
    if (parent_local != (lysc_node *)0x0) {
      *(lyd_node **)parent_local = match;
    }
    last_local = local_48;
  }
  else {
    last_local = last->next;
  }
  return last_local;
}

Assistant:

struct lyd_node *
lys_getnext_data(const struct lyd_node *last, const struct lyd_node *sibling, const struct lysc_node **slast,
        const struct lysc_node *parent, const struct lysc_module *module)
{
    const struct lysc_node *siter = NULL;
    struct lyd_node *match = NULL;

    assert(parent || module);
    assert(!last || (slast && *slast));

    if (slast) {
        siter = *slast;
    }

    if (last && last->next && (last->next->schema == siter)) {
        /* return next data instance */
        return last->next;
    }

    /* find next schema node data instance */
    while ((siter = lys_getnext(siter, parent, module, 0))) {
        if (!lyd_find_sibling_val(sibling, siter, NULL, 0, &match)) {
            break;
        }
    }

    if (slast) {
        *slast = siter;
    }
    return match;
}